

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O3

void __thiscall
FragmentTest_MakeReadOnlySection_Test::TestBody(FragmentTest_MakeReadOnlySection_Test *this)

{
  fragment *pfVar1;
  undefined1 auVar2 [8];
  pointer psVar3;
  pointer psVar4;
  uint uVar5;
  void *pvVar6;
  generic_section *this_00;
  pointer psVar7;
  uchar *puVar8;
  char *pcVar9;
  char *in_R9;
  ptrdiff_t _Num;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  pointer *__ptr;
  uchar *puVar13;
  extent<pstore::repo::fragment> eVar14;
  container<unsigned_char> cVar15;
  initializer_list<pstore::repo::section_kind> __l;
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> expected;
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> actual;
  array<pstore::repo::section_content,_1UL> c;
  AssertHelper local_1c0;
  undefined1 local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [8];
  const_pointer peStack_188;
  undefined1 local_180;
  AssertHelper local_178;
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> local_170;
  _Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> local_158;
  void *local_138;
  undefined8 uStack_130;
  long local_128;
  fragment *local_118;
  undefined1 local_110 [8];
  AssertHelperData *local_108;
  uchar local_100 [128];
  pointer local_80;
  pointer local_70;
  uchar *local_68;
  pointer local_60;
  pointer piStack_58;
  pointer local_50;
  pointer peStack_48;
  pointer local_40;
  pointer peStack_38;
  
  local_110[0] = read_only;
  local_110[1] = '\x04';
  memset((small_vector<unsigned_char,128ul> *)&local_108,0,0xa0);
  local_60 = (pointer)0x0;
  piStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  peStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  peStack_38 = (pointer)0x0;
  local_1b8._0_6_ = 0x617461646f72;
  local_68 = local_100;
  pstore::small_vector<unsigned_char,128ul>::assign<unsigned_char_const*>
            ((small_vector<unsigned_char,128ul> *)&local_108,local_1b8,local_1b8 + 6);
  eVar14 = (anonymous_namespace)::build_fragment<pstore::repo::section_content*>
                     (&(this->super_FragmentTest).transaction_,(section_content *)local_110,
                      (section_content *)&stack0xffffffffffffffd0);
  local_190 = (undefined1  [8])eVar14.addr.a_.a_;
  testing::internal::CmpHelperEQ<unsigned_char*,unsigned_char_const*>
            ((internal *)local_1b8,"transaction_.get_storage ().begin ()->first",
             "reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ())",
             (uchar **)
             (*(_Base_ptr *)
               ((long)&(this->super_FragmentTest).transaction_.storage_._M_t._M_impl.
                       super__Rb_tree_header._M_header + 0x10) + 1),(uchar **)local_190);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x6c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_190 + 8))();
    }
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
    goto LAB_0011991d;
  }
  if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1b0,pbStack_1b0);
  }
  pfVar1 = *(fragment **)
            (*(_Base_ptr *)
              ((long)&(this->super_FragmentTest).transaction_.storage_._M_t._M_impl.
                      super__Rb_tree_header._M_header + 0x10) + 1);
  local_1b8[0] = (internal)0xb;
  __l._M_len = 1;
  __l._M_array = local_1b8;
  std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::vector
            (&local_170,__l,(allocator_type *)local_190);
  uVar11 = (pfVar1->arr_).sa_.bitmap_;
  if ((ulong)uVar11 == 0) {
    peStack_188 = (const_pointer)0x0;
    uVar11 = 0;
  }
  else {
    uVar5 = pstore::bit_count::ctz((ulong)uVar11);
    uVar11 = uVar11 >> ((byte)uVar5 & 0x1f);
    peStack_188 = (const_pointer)(ulong)uVar5;
  }
  local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
  pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
  local_190._0_4_ = uVar11;
  local_180 = 0;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  local_128 = 0;
  std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>::
  _M_range_initialize<pstore::repo::details::cast_iterator<pstore::repo::section_kind,pstore::sparse_array<unsigned_long,unsigned_int>::indices::const_iterator>>
            ();
  uVar12 = (long)local_170.
                 super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_170.
                 super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_118 = pfVar1;
  if (uVar12 == 0) {
    pvVar6 = (void *)0x0;
    sVar10 = 0;
    psVar7 = local_170.
             super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if ((long)uVar12 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar6 = operator_new(uVar12);
    sVar10 = (long)local_170.
                   super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_170.
                   super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = local_170.
             super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  psVar3 = local_170.
           super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar7 != local_170.
                super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    memmove(pvVar6,local_170.
                   super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                   ._M_impl.super__Vector_impl_data._M_start,sVar10);
  }
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::
  _M_create_storage(&local_158,sVar10);
  psVar4 = local_158._M_impl.super__Vector_impl_data._M_start;
  if (psVar7 != psVar3) {
    memmove(local_158._M_impl.super__Vector_impl_data._M_start,pvVar6,sVar10);
  }
  local_158._M_impl.super__Vector_impl_data._M_finish = psVar4 + sVar10;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,uVar12);
  }
  uVar12 = (long)local_158._M_impl.super__Vector_impl_data._M_finish -
           (long)local_158._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 == 0) {
    pvVar6 = (void *)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar12 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar6 = operator_new(uVar12);
    sVar10 = (long)local_158._M_impl.super__Vector_impl_data._M_finish -
             (long)local_158._M_impl.super__Vector_impl_data._M_start;
  }
  psVar3 = local_158._M_impl.super__Vector_impl_data._M_finish;
  psVar7 = local_158._M_impl.super__Vector_impl_data._M_start;
  if (local_158._M_impl.super__Vector_impl_data._M_finish !=
      local_158._M_impl.super__Vector_impl_data._M_start) {
    memmove(pvVar6,local_158._M_impl.super__Vector_impl_data._M_start,sVar10);
  }
  local_1b8 = (undefined1  [8])0x0;
  pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = 0;
  std::_Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::
  _M_create_storage((_Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                     *)local_1b8,sVar10);
  auVar2 = local_1b8;
  if (psVar3 != psVar7) {
    memmove((void *)local_1b8,pvVar6,sVar10);
  }
  pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)auVar2 + sVar10);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,uVar12);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>>>>
  ::operator()(local_190,local_1b8,
               (vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *)
               "actual");
  pfVar1 = local_118;
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
  }
  if (local_158._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if (peStack_188 == (const_pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((_Alloc_hider *)&peStack_188->name)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x72,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1b8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_1b8 + 8))();
    }
  }
  if (peStack_188 != (const_pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&peStack_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peStack_188);
  }
  this_00 = pstore::repo::fragment::
            at_impl<(pstore::repo::section_kind)11,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (pfVar1);
  local_190._0_4_ = 4;
  local_1c0.data_._0_4_ = 1 << (*(byte *)&this_00->field_0 & 0x1f);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1b8,"4U","section_alignment (s)",(uint *)local_190,(uint *)&local_1c0
            );
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x76,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_190 + 8))();
    }
  }
  if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1b0,pbStack_1b0);
  }
  local_1c0.data_._0_4_ = 6;
  local_190 = (undefined1  [8])this_00->data_size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1b8,"6U","section_size (s)",(uint *)&local_1c0,
             (unsigned_long *)local_190);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x77,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_190 + 8))();
    }
  }
  if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1b0,pbStack_1b0);
  }
  cVar15 = pstore::repo::generic_section::payload(this_00);
  puVar13 = cVar15.begin_;
  cVar15 = pstore::repo::generic_section::payload(this_00);
  puVar8 = local_68;
  local_190 = (undefined1  [8])((long)cVar15.end_ - (long)puVar13);
  local_1c0.data_ = local_108;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_1b8,"std::distance (data_begin, data_end)",
             "std::distance (rodata_begin, rodata_end)",(long *)local_190,(long *)&local_1c0);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x7d,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
LAB_001198b5:
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_190 + 8))();
    }
  }
  else {
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
    for (; puVar13 != cVar15.end_; puVar13 = puVar13 + 1) {
      if (*puVar13 != *puVar8) {
        local_190 = (undefined1  [8])((ulong)local_190 & 0xffffffffffffff00);
        peStack_188 = (const_pointer)0x0;
        testing::Message::Message((Message *)&local_1c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1b8,(internal *)local_190,
                   (AssertionResult *)"std::equal (data_begin, data_end, rodata_begin)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x7e,(char *)local_1b8);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b8 != (undefined1  [8])&local_1a8) {
          operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
        }
        if (local_1c0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_1c0.data_ + 8))();
        }
        if (peStack_188 != (const_pointer)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&peStack_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       peStack_188);
        }
        break;
      }
      puVar8 = puVar8 + 1;
    }
    local_190._0_4_ = 4;
    local_1c0.data_._0_4_ = 1 << (*(byte *)&this_00->field_0 & 0x1f);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_1b8,"4U","s.align ()",(uint *)local_190,(uint *)&local_1c0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x7f,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_190 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_190 + 8))();
      }
    }
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
    local_178.data_._0_4_ = 0;
    cVar15 = pstore::repo::generic_section::payload(this_00);
    local_190 = (undefined1  [8])((ulong)(cVar15.end_ + 7) & 0xfffffffffffffff8);
    peStack_188 = (const_pointer)
                  ((long)local_190 + (ulong)((this_00->field_0).field32_ >> 8) * 0x18);
    local_1c0.data_ =
         (AssertHelperData *)
         pstore::repo::container<pstore::repo::internal_fixup>::size
                   ((container<pstore::repo::internal_fixup> *)local_190);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_1b8,"0U","s.ifixups ().size ()",(uint *)&local_178,
               (unsigned_long *)&local_1c0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x80,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_190 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_190 + 8))();
      }
    }
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
    local_178.data_._0_4_ = 0;
    cVar15 = pstore::repo::generic_section::payload(this_00);
    local_190 = (undefined1  [8])
                ((ulong)(cVar15.end_ + (ulong)((this_00->field_0).field32_ >> 8) * 0x18 + 7) &
                0xfffffffffffffff8);
    peStack_188 = (const_pointer)((ulong)this_00->num_xfixups_ * 0x20 + (long)local_190);
    local_1c0.data_ =
         (AssertHelperData *)
         pstore::repo::container<pstore::repo::external_fixup>::size
                   ((container<pstore::repo::external_fixup> *)local_190);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_1b8,"0U","s.xfixups ().size ()",(uint *)&local_178,
               (unsigned_long *)&local_1c0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x81,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_190 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_190 + 8))();
      }
    }
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
    if (((pfVar1->arr_).sa_.bitmap_ & 0x40000) == 0) {
      local_190 = (undefined1  [8])0x0;
    }
    else {
      local_190 = (undefined1  [8])
                  pstore::repo::fragment::
                  at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                            (pfVar1);
    }
    local_1c0.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<pstore::repo::linked_definitions_const*,decltype(nullptr)>
              ((internal *)local_1b8,"f->atp<section_kind::linked_definitions> ()","nullptr",
               (linked_definitions **)local_190,&local_1c0.data_);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (pbStack_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pbStack_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x82,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_190);
      goto LAB_001198b5;
    }
  }
  if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1b0,pbStack_1b0);
  }
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  if (local_170.
      super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.
                    super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.
                          super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.
                          super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0011991d:
  if (peStack_48 != (pointer)0x0) {
    operator_delete(peStack_48,(long)peStack_38 - (long)peStack_48);
  }
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80,(long)local_70 - (long)local_80);
  }
  return;
}

Assistant:

TEST_F (FragmentTest, MakeReadOnlySection) {
    std::array<section_content, 1> c = {{{section_kind::read_only, std::uint8_t{4} /*alignment*/}}};
    section_content & rodata = c.back ();
    rodata.data.assign ({'r', 'o', 'd', 'a', 't', 'a'});
    auto extent = build_fragment (transaction_, std::begin (c), std::end (c));

    ASSERT_EQ (transaction_.get_storage ().begin ()->first,
               reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ()));
    auto f = reinterpret_cast<fragment const *> (transaction_.get_storage ().begin ()->first);

    std::vector<section_kind> const expected{section_kind::read_only};
    auto const indices = f->members ().get_indices ();
    std::vector<section_kind> const actual{std::begin (indices), std::end (indices)};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));

    generic_section const & s = f->at<section_kind::read_only> ();

    EXPECT_EQ (4U, section_alignment (s));
    EXPECT_EQ (6U, section_size (s));

    auto data_begin = std::begin (s.payload ());
    auto data_end = std::end (s.payload ());
    auto rodata_begin = std::begin (rodata.data);
    auto rodata_end = std::end (rodata.data);
    ASSERT_EQ (std::distance (data_begin, data_end), std::distance (rodata_begin, rodata_end));
    EXPECT_TRUE (std::equal (data_begin, data_end, rodata_begin));
    EXPECT_EQ (4U, s.align ());
    EXPECT_EQ (0U, s.ifixups ().size ());
    EXPECT_EQ (0U, s.xfixups ().size ());
    EXPECT_EQ (f->atp<section_kind::linked_definitions> (), nullptr);
}